

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Gia_ManCountFanoutlessFlops(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  Gia_ManCreateRefs(p);
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_1c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _Counter = Gia_ManCi(p,iVar1 + local_1c);
      bVar2 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjRefNum(p,_Counter);
    if (iVar1 == 0) {
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  printf("Fanoutless flops = %d.\n",(ulong)local_20);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManCountFanoutlessFlops( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    int Counter = 0;
    Gia_ManCreateRefs( p );
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) == 0 )
            Counter++;
    printf( "Fanoutless flops = %d.\n", Counter );
    ABC_FREE( p->pRefs );
}